

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Compiler::processLine
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line)

{
  bool bVar1;
  DataType DVar2;
  int iVar3;
  const_reference pvVar4;
  char *pcVar5;
  Scope *pSVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char local_68 [48];
  string local_38 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *line_local;
  Compiler *this_local;
  
  local_18 = line;
  line_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(line);
  if (bVar1) {
    return;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,0);
  bVar1 = std::operator==(pvVar4,"Console");
  if (bVar1) {
    processConsole(this,local_18);
    return;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,0);
  DVar2 = stringToDataType(pvVar4);
  if (DVar2 == UNKNOWN) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,0);
    bVar1 = std::operator==(pvVar4,"auto");
    if (bVar1) goto LAB_0010740f;
  }
  else {
LAB_0010740f:
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_18);
    if (sVar7 < 3) {
LAB_00107440:
      processVariable(this,local_18);
      return;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,2);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
    if (*pcVar5 != '(') goto LAB_00107440;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,0);
  bVar1 = std::operator==(pvVar4,"if");
  if (bVar1) {
    processIF(this,local_18);
    return;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_18,0);
  bVar1 = std::operator==(pvVar4,"{");
  if (!bVar1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,0);
    bVar1 = std::operator==(pvVar4,"}");
    if (!bVar1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_18,0);
      bVar1 = std::operator==(pvVar4,"class");
      if (bVar1) {
        processClassDefinition(this,local_18);
        return;
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::front(local_18);
      std::__cxx11::string::string(local_38,(string *)pvVar4);
      iVar3 = VirtualStack::isVariable(&(this->igen).super_VirtualStack,(string *)local_38);
      std::__cxx11::string::~string(local_38);
      if (iVar3 != -1) {
        processVariable(this,local_18);
        return;
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_18,0);
      bVar1 = std::operator==(pvVar4,"goto");
      if (!bVar1) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_18,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_18,0);
        std::__cxx11::string::size();
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
        if (*pcVar5 != ':') {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_18,0);
          bVar1 = std::operator==(pvVar4,"while");
          if (bVar1) {
            processWhile(this,local_18);
            return;
          }
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_18,0);
          bVar1 = std::operator==(pvVar4,"else");
          if (bVar1) {
            processElse(this,local_18);
            return;
          }
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_18,0);
          bVar1 = std::operator==(pvVar4,"for");
          if (bVar1) {
            processFor(this,local_18);
            return;
          }
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_18,0);
          pSVar6 = getPastScope(this,pvVar4);
          if (pSVar6 == (Scope *)0x0) {
            sVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(local_18);
            if (2 < sVar7) {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](local_18,2);
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
              if (*pcVar5 == '(') goto LAB_001076ea;
            }
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_18,0);
            bVar1 = std::operator==(pvVar4,"return");
            if (bVar1) {
              processReturn(this,local_18);
              return;
            }
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](local_18,0);
            std::operator+(local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x1216e6);
            std::operator+(__lhs,local_68);
            __cxa_throw(__lhs,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
LAB_001076ea:
          processFunction(this,local_18,true);
          return;
        }
      }
      processGoto(this,local_18);
      return;
    }
  }
  processScope(this,local_18);
  return;
}

Assistant:

void Compiler::processLine(const std::vector<std::string>& line)
{
    //Don't do anything if there's nothing in it
    if(line.empty())
        return;

    //Check to see what the line wants to do
    if(line[0] == "Console")
        processConsole(line);
    else if((stringToDataType(line[0]) != DataType::UNKNOWN || line[0] == "auto") && !(line.size() > 2 && line[2][0] == '('))
        processVariable(line);
    else if(line[0] == "if")
        processIF(line);
    else if((line[0] == "{" || line[0] == "}"))
        processScope(line);
    else if(line[0] == "class")
        processClassDefinition(line);
    else if(igen.isVariable(line.front()) != -1)
        processVariable(line);
    else if(line[0] == "goto" || line[0][line[0].size()-1] == ':')
        processGoto(line);
    else if(line[0] == "while")
        processWhile(line);
    else if(line[0] == "else")
        processElse(line);
    else if(line[0] == "for")
        processFor(line);
    else if(getPastScope(line[0]) != nullptr || (line.size() > 2 && line[2][0] == '('))
        processFunction(line);
    else if(line[0] == "return")
        processReturn(line);
    else //Else unknown
        throw std::string("'" + line[0] + "' is undefined");
}